

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O0

void __thiscall
hiberlite::
stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>
::putNext(stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>
          *this,pair<int,_double> *el)

{
  set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
  *this_00;
  iterator iVar1;
  pair<int,_double> *el_local;
  stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>
  *this_local;
  
  this_00 = this->ct;
  iVar1 = std::
          set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
          ::end(this->ct);
  std::
  set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
  ::insert(this_00,(const_iterator)iVar1._M_node,el);
  iVar1 = std::
          set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
          ::end(this->ct);
  (this->it)._M_node = iVar1._M_node;
  return;
}

Assistant:

void putNext(E& el){
			ct.insert(ct.end(), el);
			it=ct.end();
		}